

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::InternalMetadata::DoClear<std::__cxx11::string>(InternalMetadata *this)

{
  InternalMetadata *this_local;
  
  mutable_unknown_fields<std::__cxx11::string>(this);
  std::__cxx11::string::clear();
  return;
}

Assistant:

void InternalMetadata::DoClear<std::string>() {
  mutable_unknown_fields<std::string>()->clear();
}